

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rayleigh_dist.hpp
# Opt level: O0

result_type_conflict3 * __thiscall
trng::rayleigh_dist<long_double>::pdf(rayleigh_dist<long_double> *this,result_type_conflict3 x)

{
  result_type_conflict3 *extraout_RAX;
  param_type *in_RSI;
  result_type_conflict3 *in_RDI;
  double __x;
  longdouble in_stack_00000008;
  result_type_conflict3 t;
  
  if ((longdouble)0 < in_stack_00000008) {
    param_type::nu(in_RDI,in_RSI);
    param_type::nu(in_RDI,in_RSI);
    std::exp(__x);
    in_RDI = extraout_RAX;
  }
  return in_RDI;
}

Assistant:

pdf(result_type x) const {
      if (x <= 0)
        return 0;
      const result_type t{x / (P.nu() * P.nu())};
      return t * math::exp(-t * x / 2);
    }